

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
::on_format_specs(format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                  *this,wchar_t *begin,wchar_t *end)

{
  size_t *psVar1;
  basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>
  *pbVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  type tVar5;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
  handler;
  format_specs local_88;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
  local_68;
  arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  local_50;
  
  local_68.
  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  .super_specs_setter<wchar_t>.specs_ = &local_88;
  pwVar4 = (this->context).
           super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
           .parse_context_.format_str_.data_;
  (this->context).
  super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
  .parse_context_.format_str_.data_ = begin;
  psVar1 = &(this->context).
            super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
            .parse_context_.format_str_.size_;
  *psVar1 = *psVar1 - ((long)begin - (long)pwVar4 >> 2);
  pbVar2 = &this->context;
  local_68.arg_type_ = (this->arg).type_;
  if (local_68.arg_type_ == custom_type) {
    (*(this->arg).value_.field_0.custom.format)
              ((void *)(this->arg).value_.field_0.long_long_value,pbVar2);
    pwVar4 = (this->context).
             super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
             .parse_context_.format_str_.data_;
  }
  else {
    local_88.super_align_spec.width_ = 0;
    local_88.super_align_spec.fill_ = L' ';
    local_88.super_align_spec.align_ = ALIGN_DEFAULT;
    local_88.super_core_format_specs.precision = -1;
    local_88.super_core_format_specs.flags = '\0';
    local_88.super_core_format_specs.type = '\0';
    local_68.
    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
    .context_ = pbVar2;
    pwVar4 = internal::
             parse_format_specs<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&>
                       (begin,end,&local_68);
    if ((pwVar4 == end) || (*pwVar4 != L'}')) {
      internal::error_handler::on_error((error_handler *)this,"missing \'}\' in format string");
    }
    pwVar3 = (this->context).
             super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
             .parse_context_.format_str_.data_;
    (this->context).
    super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
    .parse_context_.format_str_.data_ = pwVar4;
    psVar1 = &(this->context).
              super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
              .parse_context_.format_str_.size_;
    *psVar1 = *psVar1 - ((long)pwVar4 - (long)pwVar3 >> 2);
    local_50.
    super_arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
    .writer_.out_.container =
         (this->context).
         super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
         .out_.container;
    local_50.
    super_arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
    .writer_.locale_.locale_ =
         (this->context).
         super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
         .loc_.locale_;
    local_50.
    super_arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
    .specs_ = &local_88;
    local_50.ctx_ = pbVar2;
    tVar5 = visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>,fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
                      (&local_50,&this->arg);
    (this->context).
    super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
    .out_.container = tVar5.container;
  }
  return pwVar4;
}

Assistant:

const Char *on_format_specs(const Char *begin, const Char *end) {
    auto &parse_ctx = context.parse_context();
    parse_ctx.advance_to(begin);
    internal::custom_formatter<Char, Context> f(context);
    if (visit_format_arg(f, arg))
      return parse_ctx.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    internal::specs_checker<specs_handler<Context>>
        handler(specs_handler<Context>(specs, context), arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}')
      on_error("missing '}' in format string");
    parse_ctx.advance_to(begin);
    context.advance_to(visit_format_arg(ArgFormatter(context, &specs), arg));
    return begin;
  }